

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastEr0S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  ushort *puVar7;
  
  if ((data.field_0._0_2_ != 0) || (bVar1 = ptr[2], data.field_0._3_1_ < bVar1)) {
    pcVar5 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar5;
  }
  puVar3 = (uint *)RefAt<int>(msg,(ulong)data.field_0 >> 0x30);
  *puVar3 = (uint)bVar1;
  puVar7 = (ushort *)(ptr + 3);
  uVar6 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar7) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar3 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar3 = *puVar3 | (uint)uVar6;
    }
    return (char *)puVar7;
  }
  uVar2 = (uint)table->fast_idx_mask & (uint)*puVar7;
  if ((uVar2 & 7) == 0) {
    uVar4 = (ulong)(uVar2 & 0xfffffff8);
    pcVar5 = (char *)(**(code **)(&table[1].has_bits_offset + uVar4))
                               (msg,puVar7,ctx,
                                (ulong)*puVar7 ^ *(ulong *)(&table[1].fast_idx_mask + uVar4 * 2),
                                table,uVar6);
    return pcVar5;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastEr0S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularEnumSmallRange<uint16_t, 0>(
      PROTOBUF_TC_PARAM_PASS);
}